

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O1

void __thiscall
amrex::algoim::
ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
::tensorProductIntegral
          (ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
           *this)

{
  int iVar1;
  double w;
  GpuArray<double,_3U> x_00;
  int dim;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iloop;
  int iVar5;
  GpuArray<int,_2U> i;
  GpuArray<double,_3U> x;
  int local_40 [2];
  double local_38 [3];
  
  local_40[0] = 0;
  local_40[1] = 0;
  iVar5 = 0;
  do {
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    lVar2 = 0;
    iVar4 = 0;
    w = 1.0;
    do {
      if ((this->free).arr[lVar2] == true) {
        iVar1 = *(int *)((long)local_38 + (long)iVar4 * 4 + -8);
        local_38[lVar2] = (double)(&DAT_007a6480)[iVar1] + -0.5;
        w = w * (double)(&DAT_007a64a0)[iVar1];
        iVar4 = iVar4 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    x_00.arr[1] = local_38[1];
    x_00.arr[0] = local_38[0];
    x_00.arr[2] = local_38[2];
    ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>::
    evalIntegrand(this->f,x_00,w);
    uVar3 = 1;
    do {
      iVar4 = *(int *)((long)local_38 + uVar3 * 4 + -8);
      *(int *)((long)local_38 + uVar3 * 4 + -8) = iVar4 + 1;
      if (iVar4 < 3) break;
      *(undefined4 *)((long)local_38 + uVar3 * 4 + -8) = 0;
      iVar4 = (int)uVar3;
      uVar3 = (ulong)(iVar4 - 1);
    } while (iVar4 != 0);
    iVar5 = iVar5 + 1;
    if (iVar5 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void tensorProductIntegral () noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        int nloops = 1;
        for (int i = 0; i < M; ++i) {
            nloops *= p;
        }
        GpuArray<int,M> i{}; // i is initialized to zero.
        for (int iloop = 0; iloop < nloops; ++iloop)
        {
            GpuArray<Real,N> x{};
            Real w = 1.0_rt;
            for (int dim = 0, k = 0; dim < N; ++dim) {
                if (free[dim]) {
                    x[dim] = xrange.min(dim) + xrange.extent(dim) * gauss_x[i[k]];
                    w *= xrange.extent(dim) * gauss_w[i[k]];
                    ++k;
                }
            }
            f.evalIntegrand(x, w);

            for (int m = M-1; m >= 0; --m) {
                ++(i[m]);
                if (i[m] < p) {
                    break;
                } else {
                    i[m] = 0;
                }
            }
        }
    }